

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O3

void __thiscall FormatterTest_PlusSign_Test::TestBody(FormatterTest_PlusSign_Test *this)

{
  AssertHelperData *pAVar1;
  bool bVar2;
  char *pcVar3;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_string_view<char> format_str_04;
  basic_string_view<char> format_str_05;
  basic_string_view<char> format_str_06;
  basic_string_view<char> format_str_07;
  basic_string_view<char> format_str_08;
  basic_string_view<char> format_str_09;
  basic_string_view<char> format_str_10;
  basic_string_view<char> format_str_11;
  basic_string_view<char> format_str_12;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_01;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_02;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_03;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_04;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_05;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_06;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_07;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_08;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_09;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_10;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_11;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_12;
  string gtest_expected_message;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_13;
  undefined1 local_3d8 [32];
  AssertionResult local_3b8;
  char *local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  AssertionResult local_390;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_380;
  undefined1 *local_378;
  long local_370;
  undefined8 local_368;
  undefined1 local_360 [504];
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  undefined1 *local_148 [2];
  undefined1 local_138 [16];
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined8 local_88 [2];
  undefined8 local_78 [2];
  undefined8 local_68 [2];
  undefined8 local_58 [2];
  undefined8 local_48 [3];
  
  local_3b8.success_ = true;
  local_3b8._1_7_ = 0;
  local_370 = 0;
  local_380.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_368 = 500;
  format_str.size_ = 5;
  format_str.data_ = "{0:+}";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_3b8;
  args.types_ = fmt::v5::
                format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
                ::TYPES;
  local_378 = local_360;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_380,format_str,args,(locale_ref)0x0);
  pAVar1 = (AssertHelperData *)(local_3d8 + 0x10);
  local_3d8._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3d8,local_378,local_378 + local_370);
  local_380.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_378 != local_360) {
    operator_delete(local_378);
  }
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_3a8,"\"+42\"","format(\"{0:+}\", 42)",(char (*) [4])"+42",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8);
  if ((AssertHelperData *)local_3d8._0_8_ != pAVar1) {
    operator_delete((void *)local_3d8._0_8_);
  }
  if (local_3a8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_380);
    if ((undefined8 *)local_3a0._M_allocated_capacity == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_3a0._M_allocated_capacity;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3b7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3d8,(Message *)&local_380);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3d8);
    if (((local_380.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_380.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_380.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0._M_allocated_capacity,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3b8.success_ = true;
  local_3b8._1_7_ = 0xffffff;
  local_370 = 0;
  local_380.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_368 = 500;
  format_str_00.size_ = 5;
  format_str_00.data_ = "{0:+}";
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_3b8;
  args_00.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  local_378 = local_360;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_380,format_str_00,args_00,(locale_ref)0x0);
  local_3d8._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3d8,local_378,local_378 + local_370);
  local_380.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_378 != local_360) {
    operator_delete(local_378);
  }
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_3a8,"\"-42\"","format(\"{0:+}\", -42)",(char (*) [4])0x23b7d2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8);
  if ((AssertHelperData *)local_3d8._0_8_ != pAVar1) {
    operator_delete((void *)local_3d8._0_8_);
  }
  if (local_3a8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_380);
    if ((undefined8 *)local_3a0._M_allocated_capacity == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_3a0._M_allocated_capacity;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3b8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3d8,(Message *)&local_380);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3d8);
    if (((local_380.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_380.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_380.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0._M_allocated_capacity,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3b8.success_ = true;
  local_3b8._1_7_ = 0;
  local_370 = 0;
  local_380.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_368 = 500;
  format_str_01.size_ = 5;
  format_str_01.data_ = "{0:+}";
  args_01.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_3b8;
  args_01.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  local_378 = local_360;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_380,format_str_01,args_01,(locale_ref)0x0);
  local_3d8._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3d8,local_378,local_378 + local_370);
  local_380.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_378 != local_360) {
    operator_delete(local_378);
  }
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_3a8,"\"+42\"","format(\"{0:+}\", 42)",(char (*) [4])"+42",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8);
  if ((AssertHelperData *)local_3d8._0_8_ != pAVar1) {
    operator_delete((void *)local_3d8._0_8_);
  }
  if (local_3a8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_380);
    if ((undefined8 *)local_3a0._M_allocated_capacity == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_3a0._M_allocated_capacity;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3b9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3d8,(Message *)&local_380);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3d8);
    if (((local_380.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_380.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_380.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0._M_allocated_capacity,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if (local_3b8.success_ == true) {
    local_3d8._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3d8,"format specifier requires signed argument","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_88[0] = 0x2a;
      local_370 = 0;
      local_380.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_368 = 500;
      format_str_02.size_ = 5;
      format_str_02.data_ = "{0:+}";
      args_02.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_88;
      args_02.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_int>
           ::TYPES;
      local_378 = local_360;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_380,format_str_02,args_02,(locale_ref)0x0);
      local_a8[0] = local_98;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a8,local_378,local_378 + local_370);
      local_380.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_378 != local_360) {
        operator_delete(local_378);
      }
      if (local_a8[0] != local_98) {
        operator_delete(local_a8[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_3b8,
               (char (*) [102])
               "Expected: format(\"{0:+}\", 42u) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_3d8._0_8_ != pAVar1) {
      operator_delete((void *)local_3d8._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_380);
  if ((undefined8 *)CONCAT62(local_3b8.message_.ptr_._2_6_,local_3b8.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = *(char **)CONCAT62(local_3b8.message_.ptr_._2_6_,local_3b8.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_3d8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x3bb,pcVar3);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_3d8,(Message *)&local_380);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3d8);
  if (((local_380.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_380.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_380.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_3b8.success_ = true;
  local_3b8._1_7_ = 0;
  local_370 = 0;
  local_380.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_368 = 500;
  format_str_03.size_ = 5;
  format_str_03.data_ = "{0:+}";
  args_03.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_3b8;
  args_03.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long>
       ::TYPES;
  local_378 = local_360;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_380,format_str_03,args_03,(locale_ref)0x0);
  local_3d8._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3d8,local_378,local_378 + local_370);
  local_380.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_378 != local_360) {
    operator_delete(local_378);
  }
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_3a8,"\"+42\"","format(\"{0:+}\", 42l)",(char (*) [4])"+42",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8);
  if ((AssertHelperData *)local_3d8._0_8_ != pAVar1) {
    operator_delete((void *)local_3d8._0_8_);
  }
  if (local_3a8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_380);
    if ((undefined8 *)local_3a0._M_allocated_capacity == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_3a0._M_allocated_capacity;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3bc,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3d8,(Message *)&local_380);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3d8);
    if (((local_380.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_380.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_380.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0._M_allocated_capacity,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if (local_3b8.success_ == true) {
    local_3d8._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3d8,"format specifier requires signed argument","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_78[0] = 0x2a;
      local_370 = 0;
      local_380.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_368 = 500;
      format_str_04.size_ = 5;
      format_str_04.data_ = "{0:+}";
      args_04.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_78;
      args_04.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_long>
           ::TYPES;
      local_378 = local_360;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_380,format_str_04,args_04,(locale_ref)0x0);
      local_c8[0] = local_b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c8,local_378,local_378 + local_370);
      local_380.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_378 != local_360) {
        operator_delete(local_378);
      }
      if (local_c8[0] != local_b8) {
        operator_delete(local_c8[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_3b8,
               (char (*) [103])
               "Expected: format(\"{0:+}\", 42ul) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_3d8._0_8_ != pAVar1) {
      operator_delete((void *)local_3d8._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_380);
  if ((undefined8 *)CONCAT62(local_3b8.message_.ptr_._2_6_,local_3b8.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = *(char **)CONCAT62(local_3b8.message_.ptr_._2_6_,local_3b8.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_3d8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x3be,pcVar3);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_3d8,(Message *)&local_380);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3d8);
  if (((local_380.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_380.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_380.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_3b8.success_ = true;
  local_3b8._1_7_ = 0;
  local_370 = 0;
  local_380.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_368 = 500;
  format_str_05.size_ = 5;
  format_str_05.data_ = "{0:+}";
  args_05.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_3b8;
  args_05.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long_long>
       ::TYPES;
  local_378 = local_360;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_380,format_str_05,args_05,(locale_ref)0x0);
  local_3d8._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3d8,local_378,local_378 + local_370);
  local_380.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_378 != local_360) {
    operator_delete(local_378);
  }
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_3a8,"\"+42\"","format(\"{0:+}\", 42ll)",(char (*) [4])"+42",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8);
  if ((AssertHelperData *)local_3d8._0_8_ != pAVar1) {
    operator_delete((void *)local_3d8._0_8_);
  }
  if (local_3a8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_380);
    if ((undefined8 *)local_3a0._M_allocated_capacity == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_3a0._M_allocated_capacity;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3bf,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3d8,(Message *)&local_380);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3d8);
    if (((local_380.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_380.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_380.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0._M_allocated_capacity,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if (local_3b8.success_ == true) {
    local_3d8._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3d8,"format specifier requires signed argument","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_68[0] = 0x2a;
      local_370 = 0;
      local_380.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_368 = 500;
      format_str_06.size_ = 5;
      format_str_06.data_ = "{0:+}";
      args_06.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_68;
      args_06.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_long_long>
           ::TYPES;
      local_378 = local_360;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_380,format_str_06,args_06,(locale_ref)0x0);
      local_e8[0] = local_d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e8,local_378,local_378 + local_370);
      local_380.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_378 != local_360) {
        operator_delete(local_378);
      }
      if (local_e8[0] != local_d8) {
        operator_delete(local_e8[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_3b8,
               (char (*) [104])
               "Expected: format(\"{0:+}\", 42ull) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_3d8._0_8_ != pAVar1) {
      operator_delete((void *)local_3d8._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_380);
  if ((undefined8 *)CONCAT62(local_3b8.message_.ptr_._2_6_,local_3b8.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = *(char **)CONCAT62(local_3b8.message_.ptr_._2_6_,local_3b8.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_3d8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x3c1,pcVar3);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_3d8,(Message *)&local_380);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3d8);
  if (((local_380.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_380.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_380.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_3b8.success_ = false;
  local_3b8._1_7_ = 0x40450000000000;
  local_370 = 0;
  local_380.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_368 = 500;
  format_str_07.size_ = 5;
  format_str_07.data_ = "{0:+}";
  args_07.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_3b8;
  args_07.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,double>
       ::TYPES;
  local_378 = local_360;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_380,format_str_07,args_07,(locale_ref)0x0);
  local_3d8._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3d8,local_378,local_378 + local_370);
  local_380.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_378 != local_360) {
    operator_delete(local_378);
  }
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_3a8,"\"+42\"","format(\"{0:+}\", 42.0)",(char (*) [4])"+42",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8);
  if ((AssertHelperData *)local_3d8._0_8_ != pAVar1) {
    operator_delete((void *)local_3d8._0_8_);
  }
  if (local_3a8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_380);
    if ((undefined8 *)local_3a0._M_allocated_capacity == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_3a0._M_allocated_capacity;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3c2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3d8,(Message *)&local_380);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3d8);
    if (((local_380.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_380.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_380.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0._M_allocated_capacity,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3b8.success_ = false;
  local_3b8._1_7_ = 0xa8000000000000;
  local_3b8.message_.ptr_._0_2_ = 0x4004;
  local_370 = 0;
  local_380.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_368 = 500;
  format_str_08.size_ = 5;
  format_str_08.data_ = "{0:+}";
  args_08.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_3b8;
  args_08.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long_double>
       ::TYPES;
  local_378 = local_360;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_380,format_str_08,args_08,(locale_ref)0x0);
  local_3d8._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3d8,local_378,local_378 + local_370);
  local_380.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_378 != local_360) {
    operator_delete(local_378);
  }
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_3a8,"\"+42\"","format(\"{0:+}\", 42.0l)",(char (*) [4])"+42",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8);
  if ((AssertHelperData *)local_3d8._0_8_ != pAVar1) {
    operator_delete((void *)local_3d8._0_8_);
  }
  if (local_3a8._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_380);
    if ((undefined8 *)local_3a0._M_allocated_capacity == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_3a0._M_allocated_capacity;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3c3,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3d8,(Message *)&local_380);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3d8);
    if (((local_380.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_380.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_380.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3a0._M_allocated_capacity,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if (local_3b8.success_ == true) {
    local_3d8._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3d8,"missing \'}\' in format string","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_58[0] = 99;
      local_370 = 0;
      local_380.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_368 = 500;
      format_str_09.size_ = 4;
      format_str_09.data_ = "{0:+";
      args_09.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_58;
      args_09.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char>
           ::TYPES;
      local_378 = local_360;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_380,format_str_09,args_09,(locale_ref)0x0);
      local_108[0] = local_f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_108,local_378,local_378 + local_370);
      local_380.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_378 != local_360) {
        operator_delete(local_378);
      }
      if (local_108[0] != local_f8) {
        operator_delete(local_108[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_3b8,
               (char (*) [101])
               "Expected: format(\"{0:+\", \'c\') throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_3d8._0_8_ != pAVar1) {
      operator_delete((void *)local_3d8._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_380);
  if ((undefined8 *)CONCAT62(local_3b8.message_.ptr_._2_6_,local_3b8.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = *(char **)CONCAT62(local_3b8.message_.ptr_._2_6_,local_3b8.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_3d8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x3c5,pcVar3);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_3d8,(Message *)&local_380);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3d8);
  if (((local_380.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_380.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_380.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_3b8.success_ == true) {
    local_3d8._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3d8,"invalid format specifier for char","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_48[0] = 99;
      local_370 = 0;
      local_380.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_368 = 500;
      format_str_10.size_ = 5;
      format_str_10.data_ = "{0:+}";
      args_10.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_48;
      args_10.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char>
           ::TYPES;
      local_378 = local_360;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_380,format_str_10,args_10,(locale_ref)0x0);
      local_128[0] = local_118;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_128,local_378,local_378 + local_370);
      local_380.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_378 != local_360) {
        operator_delete(local_378);
      }
      if (local_128[0] != local_118) {
        operator_delete(local_128[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_3b8,
               (char (*) [102])
               "Expected: format(\"{0:+}\", \'c\') throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_3d8._0_8_ != pAVar1) {
      operator_delete((void *)local_3d8._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_380);
  if ((undefined8 *)CONCAT62(local_3b8.message_.ptr_._2_6_,local_3b8.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = *(char **)CONCAT62(local_3b8.message_.ptr_._2_6_,local_3b8.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_3d8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x3c7,pcVar3);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_3d8,(Message *)&local_380);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3d8);
  if (((local_380.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_380.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_380.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_3b8.success_ == true) {
    local_3d8._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3d8,"format specifier requires numeric argument","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_3a8 = "abc";
      local_370 = 0;
      local_380.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_368 = 500;
      format_str_11.size_ = 5;
      format_str_11.data_ = "{0:+}";
      args_11.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_3a8;
      args_11.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char[4]>
           ::TYPES;
      local_378 = local_360;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_380,format_str_11,args_11,(locale_ref)0x0);
      local_148[0] = local_138;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_148,local_378,local_378 + local_370);
      local_380.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_378 != local_360) {
        operator_delete(local_378);
      }
      if (local_148[0] != local_138) {
        operator_delete(local_148[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_3b8,
               (char (*) [104])
               "Expected: format(\"{0:+}\", \"abc\") throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_3d8._0_8_ != pAVar1) {
      operator_delete((void *)local_3d8._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_380);
  if ((undefined8 *)CONCAT62(local_3b8.message_.ptr_._2_6_,local_3b8.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = *(char **)CONCAT62(local_3b8.message_.ptr_._2_6_,local_3b8.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_3d8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x3c9,pcVar3);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_3d8,(Message *)&local_380);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3d8);
  if (((local_380.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_380.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_380.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_390.success_ == true) {
    local_3d8._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3d8,"format specifier requires numeric argument","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_3b8.success_ = true;
      local_3b8._1_7_ = 0;
      local_370 = 0;
      local_380.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_368 = 500;
      format_str_12.size_ = 5;
      format_str_12.data_ = "{0:+}";
      args_12.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_3b8;
      args_12.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,void*>
           ::TYPES;
      local_378 = local_360;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_380,format_str_12,args_12,(locale_ref)0x0);
      local_168[0] = local_158;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_168,local_378,local_378 + local_370);
      local_380.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_378 != local_360) {
        operator_delete(local_378);
      }
      if (local_168[0] != local_158) {
        operator_delete(local_168[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_390,
               (char (*) [128])
               "Expected: format(\"{0:+}\", reinterpret_cast<void*>(0x42)) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_3d8._0_8_ != pAVar1) {
      operator_delete((void *)local_3d8._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_380);
  if (local_390.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((local_390.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_3d8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x3cb,pcVar3);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_3d8,(Message *)&local_380);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3d8);
  if (((local_380.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_380.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_380.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_390.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  return;
}

Assistant:

TEST(FormatterTest, PlusSign) {
  EXPECT_EQ("+42", format("{0:+}", 42));
  EXPECT_EQ("-42", format("{0:+}", -42));
  EXPECT_EQ("+42", format("{0:+}", 42));
  EXPECT_THROW_MSG(format("{0:+}", 42u),
      format_error, "format specifier requires signed argument");
  EXPECT_EQ("+42", format("{0:+}", 42l));
  EXPECT_THROW_MSG(format("{0:+}", 42ul),
      format_error, "format specifier requires signed argument");
  EXPECT_EQ("+42", format("{0:+}", 42ll));
  EXPECT_THROW_MSG(format("{0:+}", 42ull),
      format_error, "format specifier requires signed argument");
  EXPECT_EQ("+42", format("{0:+}", 42.0));
  EXPECT_EQ("+42", format("{0:+}", 42.0l));
  EXPECT_THROW_MSG(format("{0:+", 'c'),
      format_error, "missing '}' in format string");
  EXPECT_THROW_MSG(format("{0:+}", 'c'),
      format_error, "invalid format specifier for char");
  EXPECT_THROW_MSG(format("{0:+}", "abc"),
      format_error, "format specifier requires numeric argument");
  EXPECT_THROW_MSG(format("{0:+}", reinterpret_cast<void*>(0x42)),
      format_error, "format specifier requires numeric argument");
}